

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3JoinType(Parse *pParse,Token *pA,Token *pB,Token *pC)

{
  Token *pTVar1;
  int iVar2;
  bool bVar3;
  char *local_60;
  char *zSp;
  int j;
  int i;
  Token *p;
  Token *apAll [3];
  int jointype;
  Token *pC_local;
  Token *pB_local;
  Token *pA_local;
  Parse *pParse_local;
  
  apAll[2]._4_4_ = 0;
  apAll[0] = pB;
  apAll[1] = pC;
  zSp._4_4_ = 0;
  do {
    bVar3 = false;
    if (zSp._4_4_ < 3) {
      bVar3 = apAll[(long)zSp._4_4_ + -1] != (Token *)0x0;
    }
    if (!bVar3) goto LAB_00176f1a;
    pTVar1 = apAll[(long)zSp._4_4_ + -1];
    for (zSp._0_4_ = 0; (int)zSp < 7; zSp._0_4_ = (int)zSp + 1) {
      if ((pTVar1->n == (uint)sqlite3JoinType::aKeyword[(int)zSp].nChar) &&
         (iVar2 = sqlite3_strnicmp(pTVar1->z,
                                   "naturaleftouterightfullinnercross" +
                                   sqlite3JoinType::aKeyword[(int)zSp].i,pTVar1->n), iVar2 == 0)) {
        apAll[2]._4_4_ = sqlite3JoinType::aKeyword[(int)zSp].code | apAll[2]._4_4_;
        break;
      }
    }
    if (6 < (int)zSp) {
      apAll[2]._4_4_ = apAll[2]._4_4_ | 0x40;
LAB_00176f1a:
      if (((apAll[2]._4_4_ & 0x21) == 0x21) || ((apAll[2]._4_4_ & 0x40) != 0)) {
        local_60 = " ";
        if (pC == (Token *)0x0) {
          local_60 = "";
        }
        sqlite3ErrorMsg(pParse,"unknown or unsupported join type: %T %T%s%T",pA,pB,local_60,pC);
        apAll[2]._4_4_ = 1;
      }
      else if (((apAll[2]._4_4_ & 0x20) != 0) && ((apAll[2]._4_4_ & 0x18) != 8)) {
        sqlite3ErrorMsg(pParse,"RIGHT and FULL OUTER JOINs are not currently supported");
        apAll[2]._4_4_ = 1;
      }
      return apAll[2]._4_4_;
    }
    zSp._4_4_ = zSp._4_4_ + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3JoinType(Parse *pParse, Token *pA, Token *pB, Token *pC){
  int jointype = 0;
  Token *apAll[3];
  Token *p;
                             /*   0123456789 123456789 123456789 123 */
  static const char zKeyText[] = "naturaleftouterightfullinnercross";
  static const struct {
    u8 i;        /* Beginning of keyword text in zKeyText[] */
    u8 nChar;    /* Length of the keyword in characters */
    u8 code;     /* Join type mask */
  } aKeyword[] = {
    /* natural */ { 0,  7, JT_NATURAL                },
    /* left    */ { 6,  4, JT_LEFT|JT_OUTER          },
    /* outer   */ { 10, 5, JT_OUTER                  },
    /* right   */ { 14, 5, JT_RIGHT|JT_OUTER         },
    /* full    */ { 19, 4, JT_LEFT|JT_RIGHT|JT_OUTER },
    /* inner   */ { 23, 5, JT_INNER                  },
    /* cross   */ { 28, 5, JT_INNER|JT_CROSS         },
  };
  int i, j;
  apAll[0] = pA;
  apAll[1] = pB;
  apAll[2] = pC;
  for(i=0; i<3 && apAll[i]; i++){
    p = apAll[i];
    for(j=0; j<ArraySize(aKeyword); j++){
      if( p->n==aKeyword[j].nChar 
          && sqlite3StrNICmp((char*)p->z, &zKeyText[aKeyword[j].i], p->n)==0 ){
        jointype |= aKeyword[j].code;
        break;
      }
    }
    testcase( j==0 || j==1 || j==2 || j==3 || j==4 || j==5 || j==6 );
    if( j>=ArraySize(aKeyword) ){
      jointype |= JT_ERROR;
      break;
    }
  }
  if(
     (jointype & (JT_INNER|JT_OUTER))==(JT_INNER|JT_OUTER) ||
     (jointype & JT_ERROR)!=0
  ){
    const char *zSp = " ";
    assert( pB!=0 );
    if( pC==0 ){ zSp++; }
    sqlite3ErrorMsg(pParse, "unknown or unsupported join type: "
       "%T %T%s%T", pA, pB, zSp, pC);
    jointype = JT_INNER;
  }else if( (jointype & JT_OUTER)!=0 
         && (jointype & (JT_LEFT|JT_RIGHT))!=JT_LEFT ){
    sqlite3ErrorMsg(pParse, 
      "RIGHT and FULL OUTER JOINs are not currently supported");
    jointype = JT_INNER;
  }
  return jointype;
}